

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> * __thiscall
TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::operator=
          (TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *this,
          TPZDohrAssembleItem<std::complex<double>_> *rval)

{
  bool bVar1;
  TPZDohrAssembleItem<std::complex<double>_> *pTVar2;
  TPZReference *in_RDI;
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *in_stack_ffffffffffffffd0;
  TPZDohrAssembleItem<std::complex<double>_> *in_stack_ffffffffffffffe0;
  TPZReference *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->fPointer != (TPZDohrAssembleItem<std::complex<double>_> *)0x0) &&
     (bVar1 = TPZReference::Decrease(in_RDI), bVar1)) {
    Release(in_stack_ffffffffffffffd0);
  }
  pTVar2 = (TPZDohrAssembleItem<std::complex<double>_> *)operator_new(0x10);
  TPZReference::TPZReference(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  in_RDI->fPointer = pTVar2;
  return (TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)in_RDI;
}

Assistant:

TPZAutoPointer &operator=(T *rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(rval);
        return *this;
    }